

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

int IsSoundFile(ctmbstr sType)

{
  Bool BVar1;
  int iVar2;
  tmbchar local_38 [8];
  tmbchar ext [20];
  uint local_1c;
  uint i;
  ctmbstr sType_local;
  
  BVar1 = IsFilePath(sType);
  if (BVar1 != no) {
    GetFileExtension(sType,local_38,0x14);
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      iVar2 = prvTidytmbstrcasecmp(local_38,soundExtensions[local_1c]);
      if (iVar2 == 0) {
        return soundExtErrCodes[local_1c];
      }
    }
  }
  return 0;
}

Assistant:

static int IsSoundFile( ctmbstr sType )
{
    uint i;
    tmbchar ext[ 20 ];

    if ( !IsFilePath(sType) ) return 0;
    
    GetFileExtension( sType, ext, sizeof(ext) );
    
    for (i = 0; i < N_AUDIO_EXTS; i++)
    {
        if ( TY_(tmbstrcasecmp)(ext, soundExtensions[i]) == 0 )
            return soundExtErrCodes[i];
    }
    return 0;
}